

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O0

void __thiscall wasm::InstrumentMemory::~InstrumentMemory(InstrumentMemory *this)

{
  InstrumentMemory *this_local;
  
  ~InstrumentMemory(this);
  operator_delete(this,0x110);
  return;
}

Assistant:

void visitLoad(Load* curr) {
    id++;
    Builder builder(*getModule());
    auto mem = getModule()->getMemory(curr->memory);
    auto indexType = mem->indexType;
    auto offset = builder.makeConstPtr(curr->offset.addr, indexType);
    curr->ptr = builder.makeCall(load_ptr,
                                 {builder.makeConst(int32_t(id)),
                                  builder.makeConst(int32_t(curr->bytes)),
                                  offset,
                                  curr->ptr},
                                 indexType);
    Name target;
    switch (curr->type.getBasic()) {
      case Type::i32:
        target = load_val_i32;
        break;
      case Type::i64:
        target = load_val_i64;
        break;
      case Type::f32:
        target = load_val_f32;
        break;
      case Type::f64:
        target = load_val_f64;
        break;
      default:
        return; // TODO: other types, unreachable, etc.
    }
    replaceCurrent(builder.makeCall(
      target, {builder.makeConst(int32_t(id)), curr}, curr->type));
  }